

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O1

void __thiscall KktChStep::printAR(KktChStep *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  char buff [4];
  char local_34 [4];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
  if (0 < this->numCol) {
    lVar12 = 0;
    do {
      sprintf(local_34,"%2.1g ",
              (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar5 = strlen(local_34);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_34,sVar5);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------AR-|-b-----\n",0x12);
  if (0 < this->RnumRow) {
    lVar12 = 0;
    do {
      if (0 < this->RnumCol) {
        iVar10 = 0;
        do {
          piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar9 = piVar2[lVar12];
          lVar7 = (long)iVar9;
          bVar13 = piVar3[lVar7] == iVar10;
          if (bVar13) {
LAB_00152c75:
            if (piVar2[lVar12 + 1] <= iVar9) goto LAB_00152cb9;
            sprintf(local_34,"%2.1g ",
                    (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7]);
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar5 = strlen(local_34);
            pcVar11 = local_34;
          }
          else {
            iVar1 = piVar2[lVar12 + 1];
            iVar4 = iVar1;
            if (iVar1 < iVar9) {
              iVar4 = iVar9;
            }
            if (iVar9 < iVar1) {
              lVar8 = lVar7;
              do {
                iVar9 = iVar9 + 1;
                lVar7 = lVar8 + 1;
                bVar13 = piVar3[lVar8 + 1] == iVar10;
                if (bVar13) goto LAB_00152c75;
                lVar8 = lVar7;
              } while (iVar4 != lVar7);
            }
            iVar9 = (int)lVar7;
            if (bVar13) goto LAB_00152c75;
LAB_00152cb9:
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar5 = 3;
            pcVar11 = "   ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar5);
          iVar10 = iVar10 + 1;
        } while (iVar10 < this->RnumCol);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |   ",6);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      poVar6 = std::ostream::_M_insert<double>
                         ((this->RrowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," < < ",5);
      poVar6 = std::ostream::_M_insert<double>
                         ((this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->RnumRow);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void KktChStep::printAR() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------AR-|-b-----\n";
	for (int i=0;i<RnumRow;i++) {
		for (int j=0;j<RnumCol;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1]) 
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{	
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
		
	}
	
	cout<<endl;
}